

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeConditional(ExpressionContext *ctx,SynConditional *syntax)

{
  bool bVar1;
  ExprBase *pEVar2;
  TypeBase *pTVar3;
  TypeArray *pTVar4;
  TypeArray *pTVar5;
  TypeClass *type;
  TypeClass *target;
  TypeClass *falseBlockTypeClass;
  TypeClass *trueBlockTypeClass;
  TypeRef *falseBlockTypeRef;
  TypeRef *trueBlockTypeRef;
  TypeArray *falseBlockTypeArray;
  TypeArray *trueBlockTypeArray;
  TypeBase *resultType;
  ExprBase *falseBlock;
  ExprBase *trueBlock;
  ExprBase *condition;
  SynConditional *syntax_local;
  ExpressionContext *ctx_local;
  
  pEVar2 = AnalyzeExpression(ctx,syntax->condition);
  pEVar2 = CreateConditionCast(ctx,pEVar2->source,pEVar2);
  AssertValueExpression(ctx,&syntax->super_SynBase,pEVar2);
  falseBlock = AnalyzeStatement(ctx,syntax->trueBlock);
  resultType = (TypeBase *)AnalyzeStatement(ctx,syntax->falseBlock);
  bVar1 = isType<TypeError>(pEVar2->type);
  if (((bVar1) || (bVar1 = isType<TypeError>(falseBlock->type), bVar1)) ||
     (bVar1 = isType<TypeError>((TypeBase *)(resultType->name).end), bVar1)) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprConditional>(ctx);
    pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprConditional::ExprConditional
              ((ExprConditional *)ctx_local,&syntax->super_SynBase,pTVar3,pEVar2,falseBlock,
               (ExprBase *)resultType);
  }
  else {
    bVar1 = AssertValueExpression(ctx,&syntax->super_SynBase,falseBlock);
    if (bVar1) {
      bVar1 = AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)resultType);
      if (bVar1) {
        if (falseBlock->type != (TypeBase *)(resultType->name).end) {
          if (falseBlock->type == ctx->typeNullPtr) {
            falseBlock = CreateCast(ctx,syntax->trueBlock,falseBlock,
                                    (TypeBase *)(resultType->name).end,false);
          }
          if ((TypeBase *)(resultType->name).end == ctx->typeNullPtr) {
            resultType = (TypeBase *)
                         CreateCast(ctx,syntax->falseBlock,(ExprBase *)resultType,falseBlock->type,
                                    false);
          }
        }
        trueBlockTypeArray = (TypeArray *)0x0;
        if (falseBlock->type == (TypeBase *)(resultType->name).end) {
          trueBlockTypeArray = (TypeArray *)falseBlock->type;
        }
        else {
          bVar1 = ExpressionContext::IsNumericType(ctx,falseBlock->type);
          if ((bVar1) &&
             (bVar1 = ExpressionContext::IsNumericType(ctx,(TypeBase *)(resultType->name).end),
             bVar1)) {
            trueBlockTypeArray =
                 (TypeArray *)
                 ExpressionContext::GetBinaryOpResultType
                           (ctx,falseBlock->type,(TypeBase *)(resultType->name).end);
            falseBlock = CreateCast(ctx,syntax->trueBlock,falseBlock,(TypeBase *)trueBlockTypeArray,
                                    false);
            resultType = (TypeBase *)
                         CreateCast(ctx,syntax->falseBlock,(ExprBase *)resultType,
                                    (TypeBase *)trueBlockTypeArray,false);
          }
          else {
            pTVar4 = getType<TypeArray>(falseBlock->type);
            pTVar5 = getType<TypeArray>((TypeBase *)(resultType->name).end);
            if (((pTVar4 == (TypeArray *)0x0) || (pTVar5 == (TypeArray *)0x0)) ||
               (pTVar4->subType != pTVar5->subType)) {
              pTVar4 = (TypeArray *)getType<TypeRef>(falseBlock->type);
              pTVar5 = (TypeArray *)getType<TypeRef>((TypeBase *)(resultType->name).end);
              if ((pTVar4 != (TypeArray *)0x0) && (pTVar5 != (TypeArray *)0x0)) {
                type = getType<TypeClass>(pTVar4->subType);
                target = getType<TypeClass>(pTVar5->subType);
                bVar1 = anon_unknown.dwarf_e7629::IsDerivedFrom(type,target);
                if (bVar1) {
                  falseBlock = CreateCast(ctx,syntax->trueBlock,falseBlock,(TypeBase *)pTVar5,false)
                  ;
                  trueBlockTypeArray = pTVar5;
                }
                else {
                  bVar1 = anon_unknown.dwarf_e7629::IsDerivedFrom(target,type);
                  if (bVar1) {
                    resultType = (TypeBase *)
                                 CreateCast(ctx,syntax->falseBlock,(ExprBase *)resultType,
                                            (TypeBase *)pTVar4,false);
                    trueBlockTypeArray = pTVar4;
                  }
                }
              }
              if (trueBlockTypeArray == (TypeArray *)0x0) {
                anon_unknown.dwarf_e7629::Report
                          (ctx,&syntax->super_SynBase,
                           "ERROR: can\'t find common type between \'%.*s\' and \'%.*s\'",
                           (ulong)(uint)((int)(falseBlock->type->name).end -
                                        (int)(falseBlock->type->name).begin),
                           (falseBlock->type->name).begin,
                           (ulong)(uint)((int)*(undefined8 *)((resultType->name).end + 0x18) -
                                        (int)*(undefined8 *)((resultType->name).end + 0x10)),
                           *(undefined8 *)((resultType->name).end + 0x10));
                trueBlockTypeArray = (TypeArray *)ExpressionContext::GetErrorType(ctx);
              }
            }
            else {
              trueBlockTypeArray =
                   (TypeArray *)ExpressionContext::GetUnsizedArrayType(ctx,pTVar4->subType);
              falseBlock = CreateCast(ctx,syntax->trueBlock,falseBlock,
                                      (TypeBase *)trueBlockTypeArray,false);
              resultType = (TypeBase *)
                           CreateCast(ctx,syntax->falseBlock,(ExprBase *)resultType,
                                      (TypeBase *)trueBlockTypeArray,false);
            }
          }
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprConditional>(ctx);
        ExprConditional::ExprConditional
                  ((ExprConditional *)ctx_local,&syntax->super_SynBase,
                   &trueBlockTypeArray->super_TypeBase,pEVar2,falseBlock,(ExprBase *)resultType);
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprConditional>(ctx);
        pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprConditional::ExprConditional
                  ((ExprConditional *)ctx_local,&syntax->super_SynBase,pTVar3,pEVar2,falseBlock,
                   (ExprBase *)resultType);
      }
    }
    else {
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprConditional>(ctx);
      pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprConditional::ExprConditional
                ((ExprConditional *)ctx_local,&syntax->super_SynBase,pTVar3,pEVar2,falseBlock,
                 (ExprBase *)resultType);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeConditional(ExpressionContext &ctx, SynConditional *syntax)
{
	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	AssertValueExpression(ctx, syntax, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);
	ExprBase *falseBlock = AnalyzeStatement(ctx, syntax->falseBlock);

	if(isType<TypeError>(condition->type) || isType<TypeError>(trueBlock->type) || isType<TypeError>(falseBlock->type))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, trueBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, falseBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	// Handle null pointer promotion
	if(trueBlock->type != falseBlock->type)
	{
		if(trueBlock->type == ctx.typeNullPtr)
			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, falseBlock->type, false);

		if(falseBlock->type == ctx.typeNullPtr)
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, trueBlock->type, false);
	}

	TypeBase *resultType = NULL;

	if(trueBlock->type == falseBlock->type)
	{
		resultType = trueBlock->type;
	}
	else if(ctx.IsNumericType(trueBlock->type) && ctx.IsNumericType(falseBlock->type))
	{
		resultType = ctx.GetBinaryOpResultType(trueBlock->type, falseBlock->type);

		trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
		falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
	}
	else
	{
		TypeArray *trueBlockTypeArray = getType<TypeArray>(trueBlock->type);
		TypeArray *falseBlockTypeArray = getType<TypeArray>(falseBlock->type);

		if(trueBlockTypeArray && falseBlockTypeArray && trueBlockTypeArray->subType == falseBlockTypeArray->subType)
		{
			resultType = ctx.GetUnsizedArrayType(trueBlockTypeArray->subType);

			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
		}
		else
		{
			TypeRef *trueBlockTypeRef = getType<TypeRef>(trueBlock->type);
			TypeRef *falseBlockTypeRef = getType<TypeRef>(falseBlock->type);

			if(trueBlockTypeRef && falseBlockTypeRef)
			{
				TypeClass *trueBlockTypeClass = getType<TypeClass>(trueBlockTypeRef->subType);
				TypeClass *falseBlockTypeClass = getType<TypeClass>(falseBlockTypeRef->subType);

				if(IsDerivedFrom(trueBlockTypeClass, falseBlockTypeClass))
				{
					resultType = falseBlockTypeRef;

					trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
				}
				else if(IsDerivedFrom(falseBlockTypeClass, trueBlockTypeClass))
				{
					resultType = trueBlockTypeRef;

					falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
				}
			}

			if(!resultType)
			{
				Report(ctx, syntax, "ERROR: can't find common type between '%.*s' and '%.*s'", FMT_ISTR(trueBlock->type->name), FMT_ISTR(falseBlock->type->name));

				resultType = ctx.GetErrorType();
			}
		}
	}

	return new (ctx.get<ExprConditional>()) ExprConditional(syntax, resultType, condition, trueBlock, falseBlock);
}